

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetTexParameterIVerifier *this_00;
  undefined4 extraout_var;
  TexParamVerifier *pTVar3;
  undefined4 extraout_var_00;
  undefined **ppuVar4;
  TextureWrapCase *pTVar5;
  TextureCase *pTVar6;
  int _verifierNdx;
  long lVar7;
  allocator<char> local_b9;
  undefined **local_b8;
  TextureStateQueryTests *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  TexParamVerifier *verifiers [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  this_00 = (GetTexParameterIVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  TextureParamVerifiers::GetTexParameterIVerifier::GetTexParameterIVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInt = this_00;
  pTVar3 = (TexParamVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  TextureParamVerifiers::GetTexParameterFVerifier::GetTexParameterFVerifier
            ((GetTexParameterFVerifier *)pTVar3,(Functions *)CONCAT44(extraout_var_00,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = (GetTexParameterFVerifier *)pTVar3;
  ppuVar4 = (undefined **)this->m_verifierInt;
  verifiers[0] = (TexParamVerifier *)ppuVar4;
  verifiers[1] = pTVar3;
  local_b0 = this;
  for (local_38 = 0; local_38 != 2; local_38 = local_38 + 1) {
    ppuVar4 = &PTR_anon_var_dwarf_146c325_01e17ee0;
    local_b8 = &PTR_anon_var_dwarf_146c325_01e17ee0 + local_38 * 2;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      pTVar3 = verifiers[lVar7];
      pTVar5 = (TextureWrapCase *)operator_new(0xb0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,*local_b8,&local_b9);
      std::operator+(&local_78,&local_58,"_texture_wrap_s");
      std::operator+(&local_a8,&local_78,pTVar3->m_testNamePostfix);
      anon_unknown_2::TextureWrapCase::TextureWrapCase
                (pTVar5,pCVar1,pTVar3,local_a8._M_dataplus._M_p,"TEXTURE_WRAP_S",
                 *(GLenum *)(local_b8 + 1),0x2802);
      this = local_b0;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pTVar5);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      ppuVar4 = (undefined **)std::__cxx11::string::~string((string *)&local_58);
    }
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      pTVar3 = verifiers[lVar7];
      pTVar5 = (TextureWrapCase *)operator_new(0xb0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,*local_b8,&local_b9);
      std::operator+(&local_78,&local_58,"_texture_wrap_t");
      std::operator+(&local_a8,&local_78,pTVar3->m_testNamePostfix);
      anon_unknown_2::TextureWrapCase::TextureWrapCase
                (pTVar5,pCVar1,pTVar3,local_a8._M_dataplus._M_p,"TEXTURE_WRAP_T",
                 *(GLenum *)(local_b8 + 1),0x2803);
      this = local_b0;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pTVar5);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      ppuVar4 = (undefined **)std::__cxx11::string::~string((string *)&local_58);
    }
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      pTVar3 = verifiers[lVar7];
      pTVar6 = (TextureCase *)operator_new(0xa8);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,*local_b8,&local_b9);
      std::operator+(&local_78,&local_58,"_texture_mag_filter");
      std::operator+(&local_a8,&local_78,pTVar3->m_testNamePostfix);
      anon_unknown_2::TextureCase::TextureCase
                (pTVar6,pCVar1,pTVar3,local_a8._M_dataplus._M_p,"TEXTURE_MAG_FILTER",
                 *(GLenum *)(local_b8 + 1));
      this = local_b0;
      (pTVar6->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_01e18040;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pTVar6);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      ppuVar4 = (undefined **)std::__cxx11::string::~string((string *)&local_58);
    }
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      pTVar3 = verifiers[lVar7];
      pTVar6 = (TextureCase *)operator_new(0xa8);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,*local_b8,&local_b9);
      std::operator+(&local_78,&local_58,"_texture_min_filter");
      std::operator+(&local_a8,&local_78,pTVar3->m_testNamePostfix);
      anon_unknown_2::TextureCase::TextureCase
                (pTVar6,pCVar1,pTVar3,local_a8._M_dataplus._M_p,"TEXTURE_MIN_FILTER",
                 *(GLenum *)(local_b8 + 1));
      this = local_b0;
      (pTVar6->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_01e180a0;
      tcu::TestNode::addChild((TestNode *)local_b0,(TestNode *)pTVar6);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      ppuVar4 = (undefined **)std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return (int)ppuVar4;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	using namespace TextureParamVerifiers;

	DE_ASSERT(m_verifierInt == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierInt		= new GetTexParameterIVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat		= new GetTexParameterFVerifier(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	TexParamVerifier* verifiers[] = {m_verifierInt, m_verifierFloat};

	const struct
	{
		const char*	name;
		GLenum		textureTarget;
	} textureTargets[] =
	{
		{ "texture_2d",			GL_TEXTURE_2D},
		{ "texture_cube_map",	GL_TEXTURE_CUBE_MAP}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(textureTargets); ++ndx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_s"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_S",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_S)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureWrapCase		(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_wrap_t"			+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_WRAP_T",		textureTargets[ndx].textureTarget, GL_TEXTURE_WRAP_T)));

		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMagFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_mag_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MAG_FILTER",	textureTargets[ndx].textureTarget)));
		FOR_EACH_VERIFIER(verifiers, addChild(new TextureMinFilterCase	(m_context, verifier,	(std::string(textureTargets[ndx].name)	+ "_texture_min_filter"		+ verifier->getTestNamePostfix()).c_str(), "TEXTURE_MIN_FILTER",	textureTargets[ndx].textureTarget)));
	}
}